

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O2

bool __thiscall ShParser::decodeOpcode(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  char *pcVar1;
  char cVar2;
  Token *pTVar3;
  string *psVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  string name;
  long local_38;
  ulong local_30;
  
  pcVar6 = opcode->name;
  (this->registers).grt.num = -1;
  (this->registers).grs.num = -1;
  ShImmediateData::reset(&this->immediate);
  pTVar3 = Parser::nextToken(parser);
  if (pTVar3->type == Identifier) {
    psVar4 = (string *)Token::identifierValue(pTVar3);
    std::__cxx11::string::string((string *)&local_38,psVar4);
    uVar5 = 0;
    while( true ) {
      while( true ) {
        cVar2 = *pcVar6;
        if (cVar2 == '\0') {
          bVar7 = local_30 <= uVar5;
          goto LAB_00160239;
        }
        pcVar6 = pcVar6 + 1;
        if (cVar2 == '/') break;
        if ((local_30 <= uVar5) ||
           (pcVar1 = (char *)(local_38 + uVar5), uVar5 = uVar5 + 1, cVar2 != *pcVar1))
        goto LAB_00160229;
      }
      if (uVar5 < local_30) break;
      pTVar3 = Parser::nextToken(parser);
      if (pTVar3->type != Div) break;
      pTVar3 = Parser::peekToken(parser,0);
      if (pTVar3->type != Identifier) break;
      pTVar3 = Parser::nextToken(parser);
      Token::identifierValue(pTVar3);
      std::__cxx11::string::_M_assign((string *)&local_38);
      uVar5 = 0;
    }
LAB_00160229:
    bVar7 = false;
LAB_00160239:
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ShParser::decodeOpcode(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();

	const Token &token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;
		
	const Identifier &identifier = token.identifierValue();
	std::string name = identifier.string();

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case '/':
			CHECK(pos >= name.size());
			CHECK(parser.nextToken().type == TokenType::Div);
			CHECK(parser.peekToken().type == TokenType::Identifier);
			
			name = parser.nextToken().identifierValue().string();
			pos = 0;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}